

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDiscreteAccessoryType::~IfcDiscreteAccessoryType
          (IfcDiscreteAccessoryType *this)

{
  ~IfcDiscreteAccessoryType(this);
  operator_delete(this,0x1b8);
  return;
}

Assistant:

IfcDiscreteAccessoryType() : Object("IfcDiscreteAccessoryType") {}